

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

uint __thiscall jpgd::jpeg_decoder::get_bits_no_markers(jpeg_decoder *this,int num_bits)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  int iVar5;
  byte bVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  if (num_bits == 0) {
    return 0;
  }
  uVar10 = this->m_bit_buf;
  uVar9 = uVar10 >> (-(byte)num_bits & 0x1f);
  iVar5 = this->m_bits_left;
  iVar8 = iVar5 - num_bits;
  this->m_bits_left = iVar8;
  if (iVar8 != 0 && num_bits <= iVar5) {
    this->m_bit_buf = uVar10 << ((byte)num_bits & 0x1f);
    return uVar9;
  }
  uVar10 = uVar10 << ((byte)iVar5 & 0x1f);
  this->m_bit_buf = uVar10;
  iVar5 = this->m_in_buf_left;
  if (iVar5 < 2) {
    if (iVar5 != 0) goto LAB_00124b98;
    prep_in_buffer(this);
    iVar5 = this->m_in_buf_left;
    if (iVar5 != 0) goto LAB_00124b98;
    uVar2 = this->m_tem_flag;
    this->m_tem_flag = uVar2 ^ 1;
    uVar10 = 0xd9;
    if (uVar2 == 0) {
      uVar10 = 0xff;
    }
LAB_00124c35:
    prep_in_buffer(this);
    iVar5 = this->m_in_buf_left;
    if (iVar5 != 0) goto LAB_00124c4b;
    uVar2 = this->m_tem_flag;
    this->m_tem_flag = uVar2 ^ 1;
    bVar6 = -(uVar2 == 0) | 0xd9;
  }
  else {
    puVar4 = this->m_pIn_buf_ofs;
    if ((*puVar4 != 0xff) && (puVar4[1] != 0xff)) {
      uVar10 = CONCAT11(*puVar4,puVar4[1]) | uVar10;
      this->m_in_buf_left = iVar5 + -2;
      this->m_pIn_buf_ofs = puVar4 + 2;
      goto LAB_00124d31;
    }
LAB_00124b98:
    pbVar3 = this->m_pIn_buf_ofs;
    pbVar7 = pbVar3 + 1;
    this->m_pIn_buf_ofs = pbVar7;
    uVar10 = (uint)*pbVar3;
    iVar5 = iVar5 + -1;
    this->m_in_buf_left = iVar5;
    if (uVar10 == 0xff) {
      if (iVar5 == 0) {
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 != 0) {
          pbVar7 = this->m_pIn_buf_ofs;
          goto LAB_00124bdc;
        }
        *(byte *)&this->m_tem_flag = (byte)this->m_tem_flag ^ 1;
      }
      else {
LAB_00124bdc:
        this->m_pIn_buf_ofs = pbVar7 + 1;
        bVar6 = *pbVar7;
        iVar5 = iVar5 + -1;
        this->m_in_buf_left = iVar5;
        if (bVar6 == 0) goto LAB_00124c31;
        this->m_pIn_buf_ofs = pbVar7;
        *pbVar7 = bVar6;
        this->m_in_buf_left = this->m_in_buf_left + 1;
      }
      puVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = puVar4 + -1;
      puVar4[-1] = 0xff;
      iVar5 = this->m_in_buf_left + 1;
      this->m_in_buf_left = iVar5;
    }
LAB_00124c31:
    if (iVar5 == 0) goto LAB_00124c35;
LAB_00124c4b:
    pbVar3 = this->m_pIn_buf_ofs;
    pbVar7 = pbVar3 + 1;
    this->m_pIn_buf_ofs = pbVar7;
    bVar6 = *pbVar3;
    iVar5 = iVar5 + -1;
    this->m_in_buf_left = iVar5;
    if (bVar6 == 0xff) {
      if (iVar5 == 0) {
        prep_in_buffer(this);
        iVar5 = this->m_in_buf_left;
        if (iVar5 == 0) {
          *(byte *)&this->m_tem_flag = (byte)this->m_tem_flag ^ 1;
          puVar4 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = puVar4 + -1;
          puVar4[-1] = 0xff;
          this->m_in_buf_left = this->m_in_buf_left + 1;
          bVar6 = 0xff;
          goto LAB_00124d1a;
        }
        pbVar7 = this->m_pIn_buf_ofs;
      }
      this->m_pIn_buf_ofs = pbVar7 + 1;
      bVar1 = *pbVar7;
      this->m_in_buf_left = iVar5 + -1;
      bVar6 = 0xff;
      if (bVar1 != 0) {
        this->m_pIn_buf_ofs = pbVar7;
        *pbVar7 = bVar1;
        this->m_in_buf_left = this->m_in_buf_left + 1;
        puVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = puVar4 + -1;
        puVar4[-1] = 0xff;
        this->m_in_buf_left = this->m_in_buf_left + 1;
      }
    }
  }
LAB_00124d1a:
  uVar10 = uVar10 << 8 | (uint)bVar6 | this->m_bit_buf;
  iVar8 = this->m_bits_left;
LAB_00124d31:
  this->m_bit_buf = uVar10 << (-(char)iVar8 & 0x1fU);
  this->m_bits_left = iVar8 + 0x10;
  return uVar9;
}

Assistant:

inline uint jpeg_decoder::get_bits_no_markers(int num_bits) {
  if (!num_bits)
    return 0;

  uint i = m_bit_buf >> (32 - num_bits);

  if ((m_bits_left -= num_bits) <= 0) {
    m_bit_buf <<= (num_bits += m_bits_left);

    if ((m_in_buf_left < 2) || (m_pIn_buf_ofs[0] == 0xFF) || (m_pIn_buf_ofs[1] == 0xFF)) {
      uint c1 = get_octet();
      uint c2 = get_octet();
      m_bit_buf |= (c1 << 8) | c2;
    } else {
      m_bit_buf |= ((uint)m_pIn_buf_ofs[0] << 8) | m_pIn_buf_ofs[1];
      m_in_buf_left -= 2;
      m_pIn_buf_ofs += 2;
    }

    m_bit_buf <<= -m_bits_left;

    m_bits_left += 16;

    JPGD_ASSERT(m_bits_left >= 0);
  } else
    m_bit_buf <<= num_bits;

  return i;
}